

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall BotscriptParser::parseSwitchDefault(BotscriptParser *this)

{
  List<ScopeInfo> *this_00;
  ScopeInfo *pSVar1;
  DataBuffer *this_01;
  
  this_00 = &this->m_scopeStack;
  pSVar1 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
  if (pSVar1->type != SCOPE_Switch) {
    error<>("default label outside switch");
  }
  pSVar1 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
  if (pSVar1->buffer1 != (DataBuffer *)0x0) {
    error<>("multiple default labels in one switch");
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  this_01 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(this_01,0x80);
  pSVar1 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
  pSVar1->buffer1 = this_01;
  DataBuffer::writeHeader(this_01,Drop);
  DataBuffer::writeHeader(this_01,Goto);
  addSwitchCase(this,this_01);
  return;
}

Assistant:

void BotscriptParser::parseSwitchDefault()
{
	if (SCOPE (0).type != SCOPE_Switch)
		error ("default label outside switch");

	if (SCOPE (0).buffer1 != null)
		error ("multiple default labels in one switch");

	m_lexer->mustGetNext (Token::Colon);

	// The default header is buffered into buffer1, since
	// it has to be the last of the case headers
	//
	// Since the expression is pushed into the switch
	// and is only popped when case succeeds, we have
	// to pop it with DataHeader::Drop manually if we end up in
	// a default.
	DataBuffer* buf = new DataBuffer;
	SCOPE (0).buffer1 = buf;
	buf->writeHeader (DataHeader::Drop);
	buf->writeHeader (DataHeader::Goto);
	addSwitchCase (buf);
}